

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall wasm::PrintSExpression::visitDefinedFunction(PrintSExpression *this,Function *curr)

{
  ostream *poVar1;
  Function *func;
  StackIR *ir;
  bool bVar2;
  Index IVar3;
  size_t sVar4;
  Type *pTVar5;
  Type type;
  Block *pBVar6;
  Expression **ppEVar7;
  ostream *in_RCX;
  anon_unknown_217 *this_00;
  HeapType *this_01;
  ulong uVar8;
  MixedArena *pMVar9;
  Signature SVar10;
  Iterator IVar11;
  Name name;
  undefined1 local_58 [32];
  Iterator __begin3;
  
  doIndent(this->o,this->indent);
  this->currFunction = curr;
  (this->lastPrintedLocation).fileIndex = 0;
  (this->lastPrintedLocation).lineNumber = 0;
  (this->lastPrintedLocation).columnNumber = 0;
  if ((curr->prologLocation)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    printDebugLocation(this,(DebugLocation *)
                            ((curr->prologLocation)._M_t._M_impl.super__Rb_tree_header._M_header.
                             _M_left + 1));
  }
  std::operator<<(this->o,'(');
  printMajor(this->o,"func ");
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len =
       (size_t)(curr->super_Importable).super_Named.name.super_IString.str._M_str;
  anon_unknown_217::printName
            ((anon_unknown_217 *)(curr->super_Importable).super_Named.name.super_IString.str._M_len,
             name,in_RCX);
  if ((this->currModule != (Module *)0x0) && (((this->currModule->features).features & 0x400) != 0))
  {
    std::operator<<(this->o," (type ");
    poVar1 = this->o;
    anon_unknown_217::printHeapType(poVar1,(HeapType)(curr->type).id,this->currModule);
    std::operator<<(poVar1,')');
  }
  if (((this->stackIR == false) &&
      ((curr->stackIR)._M_t.
       super___uniq_ptr_impl<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
       .
       super__Head_base<0UL,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_false>
       ._M_head_impl != (vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_> *)0x0)) &&
     (this->minify == false)) {
    std::operator<<(this->o," (; has Stack IR ;)");
  }
  this_01 = &curr->type;
  SVar10 = HeapType::getSignature(this_01);
  local_58._24_8_ = SVar10.params.id;
  sVar4 = wasm::Type::size((Type *)(local_58 + 0x18));
  if (sVar4 != 0) {
    local_58._8_8_ = this_01;
    SVar10 = HeapType::getSignature(this_01);
    local_58._0_8_ = SVar10.params.id;
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_58._24_8_ = (MixedArena *)local_58;
    IVar11 = wasm::Type::end((Type *)local_58);
    local_58._16_8_ =
         IVar11.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
    pTVar5 = (Type *)0x0;
    this_00 = (anon_unknown_217 *)0x0;
    pMVar9 = (MixedArena *)local_58;
    while ((pTVar5 != (Type *)IVar11.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index ||
           (this_01 = (HeapType *)local_58._8_8_, pMVar9 != (MixedArena *)local_58._16_8_))) {
      pTVar5 = wasm::Type::Iterator::operator*((Iterator *)(local_58 + 0x18));
      std::operator<<(this->o,this->maybeSpace);
      std::operator<<(this->o,'(');
      printMinor(this->o,"param ");
      anon_unknown_217::printLocal(this_00,(Index)this->currFunction,(Function *)this->o,in_RCX);
      std::operator<<(this->o,' ');
      poVar1 = this->o;
      anon_unknown_217::printType(poVar1,(Type)pTVar5->id,this->currModule);
      std::operator<<(poVar1,')');
      this_00 = (anon_unknown_217 *)(ulong)((int)this_00 + 1);
      pTVar5 = (Type *)((long)&(__begin3.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1);
      pMVar9 = (MixedArena *)local_58._24_8_;
      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = pTVar5;
    }
  }
  SVar10 = HeapType::getSignature(this_01);
  if (SVar10.results.id.id != 0) {
    std::operator<<(this->o,this->maybeSpace);
    poVar1 = this->o;
    SVar10 = HeapType::getSignature(this_01);
    anon_unknown_217::printResultType(poVar1,SVar10.results.id,this->currModule);
  }
  local_58._16_8_ = &this->lastPrintedLocation;
  incIndent(this);
  IVar3 = Function::getVarIndexBase(curr);
  for (uVar8 = (ulong)IVar3; sVar4 = Function::getNumLocals(curr), uVar8 < sVar4; uVar8 = uVar8 + 1)
  {
    doIndent(this->o,this->indent);
    std::operator<<(this->o,'(');
    printMinor(this->o,"local ");
    func = (Function *)this->o;
    anon_unknown_217::printLocal
              ((anon_unknown_217 *)(uVar8 & 0xffffffff),(Index)this->currFunction,func,in_RCX);
    std::operator<<((ostream *)func,' ');
    poVar1 = this->o;
    type = Function::getLocalType(curr,(Index)uVar8);
    anon_unknown_217::printType(poVar1,type,this->currModule);
    std::operator<<(poVar1,')');
    std::operator<<(this->o,this->maybeNewLine);
  }
  if ((this->stackIR == false) ||
     (ir = (curr->stackIR)._M_t.
           super___uniq_ptr_impl<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
           .
           super__Head_base<0UL,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_false>
           ._M_head_impl, ir == (StackIR *)0x0)) {
    if ((this->full == false) &&
       ((curr->body->_id == BlockId &&
        (pBVar6 = Expression::cast<wasm::Block>(curr->body),
        (pBVar6->name).super_IString.str._M_str == (char *)0x0)))) {
      pBVar6 = Expression::cast<wasm::Block>(curr->body);
      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)0x0;
      pTVar5 = (Type *)(pBVar6->list).
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                       usedElements;
      local_58._24_8_ = &pBVar6->list;
      while ((__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
              pTVar5 || ((ExpressionList *)local_58._24_8_ != &pBVar6->list))) {
        ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)(local_58 + 0x18));
        printFullLine(this,*ppEVar7);
        __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)((long)&(__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent)->id + 1);
      }
    }
    else {
      printFullLine(this,curr->body);
    }
    if (this->controlFlowDepth != 0) {
      __assert_fail("controlFlowDepth == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Print.cpp"
                    ,0xc75,"void wasm::PrintSExpression::visitDefinedFunction(Function *)");
    }
  }
  else {
    printStackIR(ir,this->o,curr);
  }
  if (((this->currFunction->epilogLocation)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)
     || (bVar2 = Function::DebugLocation::operator!=
                           ((DebugLocation *)local_58._16_8_,
                            (DebugLocation *)
                            ((this->currFunction->epilogLocation)._M_t._M_impl.super__Rb_tree_header
                             ._M_header._M_left + 1)), !bVar2)) {
    decIndent(this);
  }
  else {
    doIndent(this->o,this->indent);
    if (this->minify == false) {
      this->indent = this->indent - 1;
    }
    printDebugLocation(this,(DebugLocation *)
                            ((this->currFunction->epilogLocation)._M_t._M_impl.super__Rb_tree_header
                             ._M_header._M_left + 1));
    std::operator<<(this->o,')');
  }
  std::operator<<(this->o,this->maybeNewLine);
  return;
}

Assistant:

void visitDefinedFunction(Function* curr) {
    doIndent(o, indent);
    currFunction = curr;
    lastPrintedLocation = {0, 0, 0};
    if (currFunction->prologLocation.size()) {
      printDebugLocation(*currFunction->prologLocation.begin());
    }
    o << '(';
    printMajor(o, "func ");
    printName(curr->name, o);
    if (currModule && currModule->features.hasGC()) {
      o << " (type ";
      printHeapType(o, curr->type, currModule) << ')';
    }
    if (!stackIR && curr->stackIR && !minify) {
      o << " (; has Stack IR ;)";
    }
    if (curr->getParams().size() > 0) {
      Index i = 0;
      for (const auto& param : curr->getParams()) {
        o << maybeSpace;
        o << '(';
        printMinor(o, "param ");
        printLocal(i, currFunction, o);
        o << ' ';
        printType(o, param, currModule) << ')';
        ++i;
      }
    }
    if (curr->getResults() != Type::none) {
      o << maybeSpace;
      printResultType(o, curr->getResults(), currModule);
    }
    incIndent();
    for (size_t i = curr->getVarIndexBase(); i < curr->getNumLocals(); i++) {
      doIndent(o, indent);
      o << '(';
      printMinor(o, "local ");
      printLocal(i, currFunction, o) << ' ';
      printType(o, curr->getLocalType(i), currModule) << ')';
      o << maybeNewLine;
    }
    // Print the body.
    if (!stackIR || !curr->stackIR) {
      // It is ok to emit a block here, as a function can directly contain a
      // list, even if our ast avoids that for simplicity. We can just do that
      // optimization here..
      if (!full && curr->body->is<Block>() &&
          curr->body->cast<Block>()->name.isNull()) {
        Block* block = curr->body->cast<Block>();
        for (auto item : block->list) {
          printFullLine(item);
        }
      } else {
        printFullLine(curr->body);
      }
      assert(controlFlowDepth == 0);
    } else {
      // Print the stack IR.
      printStackIR(curr->stackIR.get(), o, curr);
    }
    if (currFunction->epilogLocation.size() &&
        lastPrintedLocation != *currFunction->epilogLocation.begin()) {
      // Print last debug location: mix of decIndent and printDebugLocation
      // logic.
      doIndent(o, indent);
      if (!minify) {
        indent--;
      }
      printDebugLocation(*currFunction->epilogLocation.begin());
      o << ')';
    } else {
      decIndent();
    }
    o << maybeNewLine;
  }